

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O0

optional<unsigned_int> __thiscall
anon_unknown.dwarf_1a655b8::EffectiveWidthVisitor::
visit<slang::ast::ReplicatedAssignmentPatternExpression>
          (EffectiveWidthVisitor *this,ReplicatedAssignmentPatternExpression *expr)

{
  bitwidth_t bVar1;
  Type *in_RSI;
  uint *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined8 local_8;
  
  slang::not_null<const_slang::ast::Type_*>::operator->
            ((not_null<const_slang::ast::Type_*> *)0x1263a0c);
  bVar1 = slang::ast::Type::getBitWidth(in_RSI);
  std::optional<unsigned_int>::optional<unsigned_int,_true>
            ((optional<unsigned_int> *)CONCAT44(bVar1,in_stack_ffffffffffffffe0),
             in_stack_ffffffffffffffd8);
  return (_Optional_base<unsigned_int,_true,_true>)(_Optional_base<unsigned_int,_true,_true>)local_8
  ;
}

Assistant:

std::optional<bitwidth_t> visit(const T& expr) {
        if constexpr (requires { expr.getEffectiveWidthImpl(); }) {
            if (expr.bad())
                return std::nullopt;

            return expr.getEffectiveWidthImpl();
        }
        else {
            return expr.type->getBitWidth();
        }
    }